

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Minisat::OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
          (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this,
          bool free)

{
  char *__ptr;
  int *__ptr_00;
  
  vec<Minisat::vec<unsigned_int>_>::clear(&this->occs,free);
  __ptr = (this->dirty).data;
  if ((__ptr != (char *)0x0) && ((this->dirty).sz = 0, free)) {
    ::free(__ptr);
    (this->dirty).data = (char *)0x0;
    (this->dirty).cap = 0;
  }
  __ptr_00 = (this->dirties).data;
  if ((__ptr_00 != (int *)0x0) && ((this->dirties).sz = 0, free)) {
    ::free(__ptr_00);
    (this->dirties).data = (int *)0x0;
    (this->dirties).cap = 0;
  }
  return;
}

Assistant:

void clear(bool free = true)
    {
        occs.clear(free);
        dirty.clear(free);
        dirties.clear(free);
    }